

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

pair<int,_int> __thiscall Game::calculateLastRoundPoints(Game *this,Round *r,bool lastRound)

{
  ulong player2;
  pointer pCVar1;
  bool bVar2;
  CardValue CVar3;
  Suit SVar4;
  pair<int,_int> pVar5;
  undefined7 in_register_00000011;
  long lVar6;
  int iVar7;
  size_t j;
  ulong player1;
  Card playedCard;
  Card cj;
  Card local_60;
  undefined4 local_58;
  int local_54;
  long local_50;
  Card local_48;
  Ruleset *local_40;
  size_t local_38;
  
  player2 = r->m_winner;
  local_38 = r->startPosition;
  local_40 = &this->m_rules;
  local_50 = 0;
  iVar7 = 0;
  pVar5.first = 0;
  local_58 = (undefined4)CONCAT71(in_register_00000011,lastRound);
  while( true ) {
    player1 = (ulong)((int)local_50 + (int)local_38 & 3);
    pCVar1 = (r->m_playedCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(r->m_playedCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) <= player1) break;
    local_60 = pCVar1[player1];
    local_54 = Ruleset::getValue(local_40,&local_60);
    CVar3 = Card::value(&local_60);
    if ((CVar3 == ASS) && (SVar4 = Card::suit(&local_60), SVar4 == DIAMONDS)) {
      bVar2 = teamMembers(this,player1,player2);
      iVar7 = iVar7 + (uint)!bVar2;
    }
    if ((char)local_58 != '\0') {
      local_48.m_suit = CLUBS;
      local_48.m_value = JACK;
      pCVar1 = (r->m_playedCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
               super__Vector_impl_data._M_start;
      player1 = player2;
      if ((ulong)((long)(r->m_playedCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) <= player2) break;
      bVar2 = Card::operator==(pCVar1 + player2,&local_48);
      iVar7 = iVar7 + (uint)bVar2;
      lVar6 = 0;
      player1 = 0;
      do {
        bVar2 = teamMembers(this,player1,player2);
        if (!bVar2) {
          pCVar1 = (r->m_playedCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(r->m_playedCards).super__Vector_base<Card,_std::allocator<Card>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) <=
              player1) goto LAB_00104c06;
          bVar2 = Card::operator==((Card *)((long)&pCVar1->m_suit + lVar6),&local_48);
          iVar7 = iVar7 + (uint)bVar2;
        }
        player1 = player1 + 1;
        lVar6 = lVar6 + 8;
      } while (player1 != 4);
    }
    pVar5.first = pVar5.first + local_54;
    local_50 = local_50 + 1;
    if (local_50 == 4) {
      pVar5.second = iVar7;
      return pVar5;
    }
  }
LAB_00104c06:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",player1);
    player1 = player2;
  } while( true );
}

Assistant:

std::pair<int, int> Game::calculateLastRoundPoints(Round r, bool lastRound) {
    size_t startingPlayer = r.getStartPosition();
    size_t winner = r.getWinner();

    int rawCardPoints = 0;
    int gamePoints = 0;
    for (size_t i = 0; i < NUMPLAYERS; i++) {
        size_t playerID = (i + startingPlayer) % NUMPLAYERS;
        Card playedCard = r.playedCards().at(playerID);
        rawCardPoints += m_rules.getValue(playedCard);

        //Catch fox
        if (playedCard.value() == CardValue::ASS && playedCard.suit() == Suit::DIAMONDS) {
            if (!teamMembers(playerID, winner))
                ++gamePoints;
        }
        //Catch CJ and win with it
        if (lastRound) {
            Card cj = Card(Suit::CLUBS, CardValue::JACK);
            if (r.playedCards().at(winner) == cj) //win with it
                ++gamePoints;
            for (size_t j = 0; j < NUMPLAYERS; j++) { //catch it
                if (!teamMembers(j, winner)) {
                    if (r.playedCards().at(j) == cj)
                        ++gamePoints;
                }
            }
        }

    }
    return std::pair<int, int>(rawCardPoints, gamePoints);

}